

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleLinear3D(tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,float v,
                   float w,IVec3 *offset)

{
  bool bVar1;
  int size;
  int size_00;
  int size_01;
  deInt32 dVar2;
  int iVar3;
  deInt32 dVar4;
  int iVar5;
  deInt32 dVar6;
  int iVar7;
  int x;
  int x_00;
  int x_01;
  TextureFormat *pTVar8;
  float s;
  float s_00;
  float s_01;
  Vector<float,_4> VVar9;
  Vec4 VVar10;
  byte local_30d;
  byte local_30c;
  byte local_30b;
  byte local_30a;
  byte local_309;
  byte local_2e9;
  Vector<float,_4> local_2e8;
  Vector<float,_4> local_2d8;
  Vector<float,_4> local_2c8;
  Vector<float,_4> local_2b8;
  Vector<float,_4> local_2a8;
  Vector<float,_4> local_298;
  Vector<float,_4> local_288;
  Vector<float,_4> local_278;
  Vector<float,_4> local_268;
  Vector<float,_4> local_258;
  Vector<float,_4> local_248;
  Vector<float,_4> local_238;
  Vector<float,_4> local_228;
  Vector<float,_4> local_218;
  Vector<float,_4> local_208;
  Vector<float,_4> local_1f8;
  Vector<float,_4> local_1e8;
  Vector<float,_4> local_1d8;
  Vector<float,_4> local_1c8;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  Vector<float,_4> local_178;
  Vector<float,_4> local_168;
  Vector<float,_4> local_158;
  Vector<float,_4> local_148;
  Vector<float,_4> local_138;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  undefined1 local_108 [8];
  Vec4 p111;
  Vec4 p011;
  Vec4 p101;
  Vec4 p001;
  Vec4 p110;
  Vec4 p010;
  Vec4 p100;
  Vec4 p000;
  bool k1UseBorder;
  bool k0UseBorder;
  bool j1UseBorder;
  bool j0UseBorder;
  bool i1UseBorder;
  bool i0UseBorder;
  float c;
  float b;
  float a;
  int k1;
  int k0;
  int j1;
  int j0;
  int i1;
  int i0;
  int z1;
  int z0;
  int y1;
  int y0;
  int x1;
  int x0;
  int depth;
  int height;
  int width;
  IVec3 *offset_local;
  float w_local;
  float v_local;
  float u_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  size = ConstPixelBufferAccess::getWidth(access);
  size_00 = ConstPixelBufferAccess::getHeight(access);
  size_01 = ConstPixelBufferAccess::getDepth(access);
  dVar2 = deFloorFloatToInt32(u - 0.5);
  iVar3 = Vector<int,_3>::x(offset);
  dVar4 = deFloorFloatToInt32(v - 0.5);
  iVar5 = Vector<int,_3>::y(offset);
  dVar6 = deFloorFloatToInt32(w - 0.5);
  iVar7 = Vector<int,_3>::z(offset);
  x = wrap(sampler->wrapS,dVar2 + iVar3,size);
  iVar3 = wrap(sampler->wrapS,dVar2 + iVar3 + 1,size);
  x_00 = wrap(sampler->wrapT,dVar4 + iVar5,size_00);
  iVar5 = wrap(sampler->wrapT,dVar4 + iVar5 + 1,size_00);
  x_01 = wrap(sampler->wrapR,dVar6 + iVar7,size_01);
  iVar7 = wrap(sampler->wrapR,dVar6 + iVar7 + 1,size_01);
  s = deFloatFrac(u - 0.5);
  s_00 = deFloatFrac(v - 0.5);
  s_01 = deFloatFrac(w - 0.5);
  local_2e9 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x,0,size);
    local_2e9 = bVar1 ^ 0xff;
  }
  local_2e9 = local_2e9 & 1;
  local_309 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar3,0,size);
    local_309 = bVar1 ^ 0xff;
  }
  local_309 = local_309 & 1;
  local_30a = 0;
  if (sampler->wrapT == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x_00,0,size_00);
    local_30a = bVar1 ^ 0xff;
  }
  local_30a = local_30a & 1;
  local_30b = 0;
  if (sampler->wrapT == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar5,0,size_00);
    local_30b = bVar1 ^ 0xff;
  }
  local_30b = local_30b & 1;
  local_30c = 0;
  if (sampler->wrapR == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x_01,0,size_01);
    local_30c = bVar1 ^ 0xff;
  }
  local_30c = local_30c & 1;
  local_30d = 0;
  if (sampler->wrapR == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar7,0,size_01);
    local_30d = bVar1 ^ 0xff;
  }
  local_30d = local_30d & 1;
  if (((local_2e9 == 0) && (local_30a == 0)) && (local_30c == 0)) {
    lookup((tcu *)(p100.m_data + 2),access,x,x_00,x_01);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p100.m_data + 2),pTVar8,sampler);
  }
  if (((local_309 == 0) && (local_30a == 0)) && (local_30c == 0)) {
    lookup((tcu *)(p010.m_data + 2),access,iVar3,x_00,x_01);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p010.m_data + 2),pTVar8,sampler);
  }
  if (((local_2e9 == 0) && (local_30b == 0)) && (local_30c == 0)) {
    lookup((tcu *)(p110.m_data + 2),access,x,iVar5,x_01);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p110.m_data + 2),pTVar8,sampler);
  }
  if (((local_309 == 0) && (local_30b == 0)) && (local_30c == 0)) {
    lookup((tcu *)(p001.m_data + 2),access,iVar3,iVar5,x_01);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p001.m_data + 2),pTVar8,sampler);
  }
  if (((local_2e9 == 0) && (local_30a == 0)) && (local_30d == 0)) {
    lookup((tcu *)(p101.m_data + 2),access,x,x_00,iVar7);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p101.m_data + 2),pTVar8,sampler);
  }
  if (((local_309 == 0) && (local_30a == 0)) && (local_30d == 0)) {
    lookup((tcu *)(p011.m_data + 2),access,iVar3,x_00,iVar7);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p011.m_data + 2),pTVar8,sampler);
  }
  if (((local_2e9 == 0) && (local_30b == 0)) && (local_30d == 0)) {
    lookup((tcu *)(p111.m_data + 2),access,x,iVar5,iVar7);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p111.m_data + 2),pTVar8,sampler);
  }
  if (((local_309 == 0) && (local_30b == 0)) && (local_30d == 0)) {
    lookup((tcu *)local_108,access,iVar3,iVar5,iVar7);
  }
  else {
    pTVar8 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)local_108,pTVar8,sampler);
  }
  operator*((tcu *)&local_198,(Vector<float,_4> *)(p100.m_data + 2),1.0 - s);
  operator*((tcu *)&local_188,&local_198,1.0 - s_00);
  operator*((tcu *)&local_178,&local_188,1.0 - s_01);
  operator*((tcu *)&local_1c8,(Vector<float,_4> *)(p010.m_data + 2),s);
  operator*((tcu *)&local_1b8,&local_1c8,1.0 - s_00);
  operator*((tcu *)&local_1a8,&local_1b8,1.0 - s_01);
  operator+((tcu *)&local_168,&local_178,&local_1a8);
  operator*((tcu *)&local_1f8,(Vector<float,_4> *)(p110.m_data + 2),1.0 - s);
  operator*((tcu *)&local_1e8,&local_1f8,s_00);
  operator*((tcu *)&local_1d8,&local_1e8,1.0 - s_01);
  operator+((tcu *)&local_158,&local_168,&local_1d8);
  operator*((tcu *)&local_228,(Vector<float,_4> *)(p001.m_data + 2),s);
  operator*((tcu *)&local_218,&local_228,s_00);
  operator*((tcu *)&local_208,&local_218,1.0 - s_01);
  operator+((tcu *)&local_148,&local_158,&local_208);
  operator*((tcu *)&local_258,(Vector<float,_4> *)(p101.m_data + 2),1.0 - s);
  operator*((tcu *)&local_248,&local_258,1.0 - s_00);
  operator*((tcu *)&local_238,&local_248,s_01);
  operator+((tcu *)&local_138,&local_148,&local_238);
  operator*((tcu *)&local_288,(Vector<float,_4> *)(p011.m_data + 2),s);
  operator*((tcu *)&local_278,&local_288,1.0 - s_00);
  operator*((tcu *)&local_268,&local_278,s_01);
  operator+((tcu *)&local_128,&local_138,&local_268);
  operator*((tcu *)&local_2b8,(Vector<float,_4> *)(p111.m_data + 2),1.0 - s);
  operator*((tcu *)&local_2a8,&local_2b8,s_00);
  operator*((tcu *)&local_298,&local_2a8,s_01);
  operator+((tcu *)&local_118,&local_128,&local_298);
  operator*((tcu *)&local_2e8,(Vector<float,_4> *)local_108,s);
  operator*((tcu *)&local_2d8,&local_2e8,s_00);
  operator*((tcu *)&local_2c8,&local_2d8,s_01);
  VVar9 = operator+(this,&local_118,&local_2c8);
  VVar10.m_data[0] = VVar9.m_data[0];
  VVar10.m_data[1] = VVar9.m_data[1];
  VVar10.m_data[2] = VVar9.m_data[2];
  VVar10.m_data[3] = VVar9.m_data[3];
  return (Vec4)VVar10.m_data;
}

Assistant:

static Vec4 sampleLinear3D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, float v, float w, const IVec3& offset)
{
	int width	= access.getWidth();
	int height	= access.getHeight();
	int depth	= access.getDepth();

	int x0 = deFloorFloatToInt32(u-0.5f)+offset.x();
	int x1 = x0+1;
	int y0 = deFloorFloatToInt32(v-0.5f)+offset.y();
	int y1 = y0+1;
	int z0 = deFloorFloatToInt32(w-0.5f)+offset.z();
	int z1 = z0+1;

	int i0 = wrap(sampler.wrapS, x0, width);
	int i1 = wrap(sampler.wrapS, x1, width);
	int j0 = wrap(sampler.wrapT, y0, height);
	int j1 = wrap(sampler.wrapT, y1, height);
	int k0 = wrap(sampler.wrapR, z0, depth);
	int k1 = wrap(sampler.wrapR, z1, depth);

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);
	float c = deFloatFrac(w-0.5f);

	bool i0UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i0, 0, width);
	bool i1UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i1, 0, width);
	bool j0UseBorder = sampler.wrapT == Sampler::CLAMP_TO_BORDER && !de::inBounds(j0, 0, height);
	bool j1UseBorder = sampler.wrapT == Sampler::CLAMP_TO_BORDER && !de::inBounds(j1, 0, height);
	bool k0UseBorder = sampler.wrapR == Sampler::CLAMP_TO_BORDER && !de::inBounds(k0, 0, depth);
	bool k1UseBorder = sampler.wrapR == Sampler::CLAMP_TO_BORDER && !de::inBounds(k1, 0, depth);

	// Border color for out-of-range coordinates if using CLAMP_TO_BORDER, otherwise execute lookups.
	Vec4 p000 = (i0UseBorder || j0UseBorder || k0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j0, k0);
	Vec4 p100 = (i1UseBorder || j0UseBorder || k0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j0, k0);
	Vec4 p010 = (i0UseBorder || j1UseBorder || k0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j1, k0);
	Vec4 p110 = (i1UseBorder || j1UseBorder || k0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j1, k0);
	Vec4 p001 = (i0UseBorder || j0UseBorder || k1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j0, k1);
	Vec4 p101 = (i1UseBorder || j0UseBorder || k1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j0, k1);
	Vec4 p011 = (i0UseBorder || j1UseBorder || k1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j1, k1);
	Vec4 p111 = (i1UseBorder || j1UseBorder || k1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j1, k1);

	// Interpolate.
	return (p000*(1.0f-a)*(1.0f-b)*(1.0f-c)) +
		   (p100*(     a)*(1.0f-b)*(1.0f-c)) +
		   (p010*(1.0f-a)*(     b)*(1.0f-c)) +
		   (p110*(     a)*(     b)*(1.0f-c)) +
		   (p001*(1.0f-a)*(1.0f-b)*(     c)) +
		   (p101*(     a)*(1.0f-b)*(     c)) +
		   (p011*(1.0f-a)*(     b)*(     c)) +
		   (p111*(     a)*(     b)*(     c));
}